

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O1

bool __thiscall duckdb::FileSystem::CanSeek(FileSystem *this)

{
  NotImplementedException *this_00;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"%s: CanSeek is not implemented!","");
  (*this->_vptr_FileSystem[0x27])(&local_40,this);
  NotImplementedException::NotImplementedException<std::__cxx11::string>
            (this_00,&local_60,&local_40);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool FileSystem::CanSeek() {
	throw NotImplementedException("%s: CanSeek is not implemented!", GetName());
}